

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalarValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)604>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  undefined8 interface;
  bool bVar1;
  int32_t modelVersion;
  TypeCase TVar2;
  TypeCase TVar3;
  int iVar4;
  CoreML *pCVar5;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  int64_t iVar9;
  int64_t iVar10;
  Scaler *pSVar11;
  long lVar12;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_2b1;
  string local_2b0;
  long local_290;
  size_t scale_size_1;
  string local_280;
  long local_260;
  size_t shift_size_1;
  string local_250;
  long local_230;
  int64_t scale_size;
  string local_220;
  long local_200;
  int64_t shift_size;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  FeatureDescription *local_158;
  FeatureDescription *output;
  FeatureDescription *input;
  undefined4 local_140;
  undefined4 local_13c;
  iterator local_138;
  size_type local_130;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_128;
  Result local_110;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_e5;
  TypeCase local_e4 [3];
  iterator local_d8;
  size_type local_d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c8;
  Result local_b0;
  undefined4 local_84;
  ValidationPolicy local_80 [4];
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *description;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  ValidationPolicy::ValidationPolicy(local_80);
  validateModelDescription(&local_70,(ModelDescription *)interface,modelVersion,local_80);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    goto LAB_00472721;
  }
  pCVar5 = (CoreML *)
           Specification::ModelDescription::input
                     ((ModelDescription *)result.m_message.field_2._8_8_);
  local_e4[0] = kInt64Type;
  local_e4[1] = 2;
  local_e4[2] = 5;
  local_d8 = local_e4;
  local_d0 = 3;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_e5);
  __l_00._M_len = local_d0;
  __l_00._M_array = local_d8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_c8,__l_00,&local_e5);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_b0,pCVar5,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)&local_c8,in_R8);
  Result::operator=((Result *)local_48,&local_b0);
  Result::~Result(&local_b0);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector(&local_c8);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_e5);
  bVar1 = Result::good((Result *)local_48);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    goto LAB_00472721;
  }
  pCVar5 = (CoreML *)
           Specification::ModelDescription::output
                     ((ModelDescription *)result.m_message.field_2._8_8_);
  input._4_4_ = 1;
  local_140 = 2;
  local_13c = 5;
  local_138 = (iterator)((long)&input + 4);
  local_130 = 3;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&input + 3));
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector(&local_128,__l,
           (allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&input + 3));
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            (&local_110,pCVar5,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)&local_128,in_R8);
  Result::operator=((Result *)local_48,&local_110);
  Result::~Result(&local_110);
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector(&local_128);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
            ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&input + 3));
  bVar1 = Result::good((Result *)local_48);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    goto LAB_00472721;
  }
  pRVar6 = Specification::ModelDescription::input
                     ((ModelDescription *)result.m_message.field_2._8_8_);
  output = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                     (pRVar6,0);
  pRVar6 = Specification::ModelDescription::output
                     ((ModelDescription *)result.m_message.field_2._8_8_);
  local_158 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
              operator[](pRVar6,0);
  pFVar7 = Specification::FeatureDescription::type(output);
  TVar2 = Specification::FeatureType::Type_case(pFVar7);
  if (TVar2 == kInt64Type) {
    pFVar7 = Specification::FeatureDescription::type(local_158);
    TVar2 = Specification::FeatureType::Type_case(pFVar7);
    if (TVar2 != kInt64Type) {
      pFVar7 = Specification::FeatureDescription::type(local_158);
      TVar2 = Specification::FeatureType::Type_case(pFVar7);
      if (TVar2 != kDoubleType) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"Input type Int64 must output to Int64 or Double.",
                   &local_179);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator(&local_179);
        goto LAB_00472721;
      }
    }
  }
  else {
    pFVar7 = Specification::FeatureDescription::type(local_158);
    TVar2 = Specification::FeatureType::Type_case(pFVar7);
    pFVar7 = Specification::FeatureDescription::type(output);
    TVar3 = Specification::FeatureType::Type_case(pFVar7);
    if (TVar2 != TVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,
                 "Type of input feature does not match the output type feature.",&local_1a1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      goto LAB_00472721;
    }
  }
  pFVar7 = Specification::FeatureDescription::type(output);
  TVar2 = Specification::FeatureType::Type_case(pFVar7);
  if (TVar2 == kMultiArrayType) {
    pFVar7 = Specification::FeatureDescription::type(output);
    pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
    iVar4 = Specification::ArrayFeatureType::shape_size(pAVar8);
    if (iVar4 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,
                 "Only 1 dimensional arrays input features are supported by the scaler.",&local_1c9)
      ;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      goto LAB_00472721;
    }
    pFVar7 = Specification::FeatureDescription::type(local_158);
    pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
    iVar4 = Specification::ArrayFeatureType::shape_size(pAVar8);
    if (iVar4 == 1) {
      pFVar7 = Specification::FeatureDescription::type(output);
      pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
      iVar9 = Specification::ArrayFeatureType::shape(pAVar8,0);
      pFVar7 = Specification::FeatureDescription::type(local_158);
      pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
      iVar10 = Specification::ArrayFeatureType::shape(pAVar8,0);
      if (iVar9 == iVar10) {
        pSVar11 = Specification::Model::scaler(format);
        iVar4 = Specification::Scaler::shiftvalue_size(pSVar11);
        lVar12 = (long)iVar4;
        local_200 = lVar12;
        if ((lVar12 != 0) && (lVar12 != 1)) {
          pFVar7 = Specification::FeatureDescription::type(output);
          pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
          iVar9 = Specification::ArrayFeatureType::shape(pAVar8,0);
          if (lVar12 != iVar9) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_220,
                       "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length."
                       ,(allocator<char> *)((long)&scale_size + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator((allocator<char> *)((long)&scale_size + 7));
            goto LAB_00472721;
          }
        }
        pSVar11 = Specification::Model::scaler(format);
        iVar4 = Specification::Scaler::scalevalue_size(pSVar11);
        lVar12 = (long)iVar4;
        local_230 = lVar12;
        if ((lVar12 != 0) && (lVar12 != 1)) {
          pFVar7 = Specification::FeatureDescription::type(output);
          pAVar8 = Specification::FeatureType::multiarraytype(pFVar7);
          iVar9 = Specification::ArrayFeatureType::shape(pAVar8,0);
          if (lVar12 != iVar9) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,
                       "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length."
                       ,(allocator<char> *)((long)&shift_size_1 + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator((allocator<char> *)((long)&shift_size_1 + 7));
            goto LAB_00472721;
          }
        }
        goto LAB_0047270a;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"Shape of output array does not match shape of input array.",
               (allocator<char> *)((long)&shift_size + 7));
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shift_size + 7));
  }
  else {
    pSVar11 = Specification::Model::scaler(format);
    iVar4 = Specification::Scaler::shiftvalue_size(pSVar11);
    local_260 = (long)iVar4;
    if ((local_260 != 0) && (local_260 != 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,
                 "For a scalar imput type, specified shift value must be empty or a scalar.",
                 (allocator<char> *)((long)&scale_size_1 + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)((long)&scale_size_1 + 7));
      goto LAB_00472721;
    }
    pSVar11 = Specification::Model::scaler(format);
    iVar4 = Specification::Scaler::scalevalue_size(pSVar11);
    local_290 = (long)iVar4;
    if ((local_290 != 0) && (local_290 != 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,
                 "For input type array, specified scale values must be empty or a scalar.",
                 &local_2b1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      goto LAB_00472721;
    }
LAB_0047270a:
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
LAB_00472721:
  local_84 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_scaler>(const Specification::Model& format) {
        const auto& description = format.description();

            // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];

        if(input.type().Type_case() == FT::kInt64Type) {
            if((output.type().Type_case() != FT::kInt64Type)
               && (output.type().Type_case() != FT::kDoubleType)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Input type Int64 must output to Int64 or Double.");
            }
        } else if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }

            // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Only 1 dimensional arrays input features are supported by the scaler.");
            }

            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                               "Shape of output array does not match shape of input array.");
            }

            // Now, make sure that the repeated values make sense.
            int64_t shift_size = static_cast<int64_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1
                 || shift_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length.");
            }

                // Now, make sure that the repeated values make sense.
            int64_t scale_size = static_cast<int64_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1
                 || scale_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length.");
            }
        } else {
                // Now, make sure that the repeated values make sense.
            size_t shift_size = static_cast<size_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For a scalar imput type, specified shift value must be empty or a scalar.");
            }

                // Now, make sure that the repeated values make sense.
            size_t scale_size = static_cast<size_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty or a scalar.");
            }
        }

        return result;
    }